

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

void __thiscall Fl_Table::col_width(Fl_Table *this,int col,int width)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (col < 0) {
    return;
  }
  uVar2 = (this->_colwidths)._size;
  uVar4 = (ulong)(int)uVar2;
  uVar5 = (ulong)(uint)col;
  if (col < (int)uVar2) {
    if ((this->_colwidths).arr[uVar5] == width) {
      return;
    }
    if (col < (int)uVar2) goto LAB_001cb5e4;
  }
  uVar1 = col + 1;
  if (uVar2 != uVar1) {
    piVar3 = (int *)realloc((this->_colwidths).arr,(ulong)uVar1 << 2);
    (this->_colwidths).arr = piVar3;
    (this->_colwidths)._size = uVar1;
  }
  if ((int)uVar2 < col) {
    piVar3 = (this->_colwidths).arr;
    do {
      piVar3[uVar4] = width;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
LAB_001cb5e4:
  (this->_colwidths).arr[uVar5] = width;
  table_resized(this);
  if (col <= this->rightcol) {
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  if (((this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0) &&
     (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
    this->_callback_context = CONTEXT_RC_RESIZE;
    this->_callback_row = 0;
    this->_callback_col = col;
    Fl_Widget::do_callback
              ((Fl_Widget *)this,(Fl_Widget *)this,(this->super_Fl_Group).super_Fl_Widget.user_data_
              );
    return;
  }
  return;
}

Assistant:

void Fl_Table::col_width(int col, int width)
{
  if ( col < 0 ) return;
  if ( col < (int)_colwidths.size() && _colwidths[col] == width ) {
    return;			// OPTIMIZATION: no change? avoid redraw
  }
  // Add column widths, even if none yet
  int now_size = (int)_colwidths.size();
  if ( col >= now_size ) {
    _colwidths.size(col+1);
    while (now_size < col) {
      _colwidths[now_size++] = width;
    }
  }
  _colwidths[col] = width;
  table_resized();
  if ( col <= rightcol ) {	// OPTIMIZATION: only redraw if onscreen or to the left
    redraw();
  }
  // COLUMN RESIZE CALLBACK
  if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
    do_callback(CONTEXT_RC_RESIZE, 0, col);
  }
}